

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O3

void test_hash(ssh_hashalg *halg)

{
  ssh_hash *psVar1;
  void *vbuf;
  uchar *ptr;
  size_t sVar2;
  ulong uVar3;
  
  psVar1 = (*halg->new)(halg);
  if (psVar1 != (ssh_hash *)0x0) {
    (*psVar1->vt->reset)(psVar1);
    vbuf = safemalloc(0x100,1,0);
    ptr = (uchar *)safemalloc(halg->hlen,1,0);
    sVar2 = (*looplimit)(0x10);
    if (sVar2 != 0) {
      uVar3 = 0;
      do {
        random_read(vbuf,0x100);
        test_index = test_index + 1;
        last_filename = dupprintf("%s/%s.%04zu",outdir,test_basename);
        (*log_to_file)(last_filename);
        BinarySink_put_data(psVar1->binarysink_,vbuf,0x100);
        (*psVar1->vt->digest)(psVar1,ptr);
        (*psVar1->vt->free)(psVar1);
        (*log_to_file)((char *)0x0);
        safefree(last_filename);
        psVar1 = (*halg->new)(halg);
        if (psVar1 != (ssh_hash *)0x0) {
          (*psVar1->vt->reset)(psVar1);
        }
        uVar3 = uVar3 + 1;
        sVar2 = (*looplimit)(0x10);
      } while (uVar3 < sVar2);
    }
    safefree(vbuf);
    safefree(ptr);
    (*psVar1->vt->free)(psVar1);
    return;
  }
  test_skipped = 1;
  return;
}

Assistant:

static void test_hash(const ssh_hashalg *halg)
{
    ssh_hash *h = ssh_hash_new(halg);
    if (!h) {
        test_skipped = true;
        return;
    }

    size_t datalen = 256;
    uint8_t *data = snewn(datalen, uint8_t);
    uint8_t *hash = snewn(halg->hlen, uint8_t);

    for (size_t i = 0; i < looplimit(16); i++) {
        random_read(data, datalen);

        log_start();
        put_data(h, data, datalen);
        ssh_hash_final(h, hash);
        log_end();

        h = ssh_hash_new(halg);
    }

    sfree(data);
    sfree(hash);
    ssh_hash_free(h);
}